

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

pair<__gnu_cxx::__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::less<std::pair<int,double>>>
           (int *begin,int *end)

{
  double *pdVar1;
  int *piVar2;
  double dVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_bool>
  pVar12;
  
  iVar5 = *begin;
  dVar3 = *(double *)(begin + 2);
  for (piVar8 = (int *)0x10;
      (*(int *)((long)begin + (long)piVar8) < iVar5 ||
      ((*(int *)((long)begin + (long)piVar8) <= iVar5 &&
       (*(double *)((long)(begin + 2) + (long)piVar8) <= dVar3 &&
        dVar3 != *(double *)((long)(begin + 2) + (long)piVar8))))); piVar8 = piVar8 + 4) {
  }
  piVar2 = (int *)((long)begin + (long)piVar8);
  if (piVar8 == (int *)0x10) {
    while (piVar9 = end, end = piVar9, piVar2 < piVar9) {
      uVar6 = piVar9[-4];
      piVar8 = (int *)(ulong)uVar6;
      end = piVar9 + -4;
      if (((int)uVar6 < iVar5) ||
         (((int)uVar6 <= iVar5 &&
          (*(double *)(piVar9 + -2) <= dVar3 && dVar3 != *(double *)(piVar9 + -2))))) break;
    }
  }
  else {
    do {
      piVar9 = end;
      uVar6 = piVar9[-4];
      piVar8 = (int *)(ulong)uVar6;
      end = piVar9 + -4;
      if ((int)uVar6 < iVar5) break;
    } while ((iVar5 < (int)uVar6) ||
            (dVar3 < *(double *)(piVar9 + -2) || dVar3 == *(double *)(piVar9 + -2)));
  }
  piVar9 = end;
  piVar11 = piVar2;
  if (piVar2 < end) {
    do {
      iVar7 = *piVar11;
      *piVar11 = *piVar9;
      *piVar9 = iVar7;
      uVar4 = *(undefined8 *)(piVar11 + 2);
      *(undefined8 *)(piVar11 + 2) = *(undefined8 *)(piVar9 + 2);
      *(undefined8 *)(piVar9 + 2) = uVar4;
      do {
        do {
          piVar8 = piVar11;
          piVar11 = piVar8 + 4;
        } while (*piVar11 < iVar5);
      } while ((*piVar11 <= iVar5) &&
              (pdVar1 = (double *)(piVar8 + 6), *pdVar1 <= dVar3 && dVar3 != *pdVar1));
      do {
        piVar10 = piVar9;
        piVar8 = piVar10 + -4;
        piVar9 = piVar8;
        if (piVar10[-4] < iVar5) break;
      } while ((iVar5 < piVar10[-4]) ||
              (dVar3 < *(double *)(piVar10 + -2) || dVar3 == *(double *)(piVar10 + -2)));
    } while (piVar11 < piVar8);
  }
  pVar12._9_7_ = (undefined7)((ulong)piVar8 >> 8);
  pVar12.second = end <= piVar2;
  *begin = piVar11[-4];
  *(undefined8 *)(begin + 2) = *(undefined8 *)(piVar11 + -2);
  piVar11[-4] = iVar5;
  *(double *)(piVar11 + -2) = dVar3;
  pVar12.first._M_current = (pair<int,_double> *)(piVar11 + -4);
  return pVar12;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }